

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esni.c
# Opt level: O0

int main(int argc,char **argv)

{
  ptls_cipher_suite_t *ppVar1;
  char *pcVar2;
  FILE *pFVar3;
  uint16_t padded_length_00;
  int iVar4;
  FILE *fp_00;
  int *piVar5;
  char *pcVar6;
  EVP_PKEY *pkey_00;
  uint64_t not_before;
  long local_1058;
  size_t i;
  EVP_PKEY *pkey;
  FILE *fp;
  uint64_t uStack_1038;
  int ch;
  uint64_t lifetime;
  ptls_cipher_suite_t *local_1028;
  uint16_t padded_length;
  anon_struct_2056_2_5014a043_conflict cipher_suites;
  anon_struct_2056_2_5014a043 key_exchanges;
  char **argv_local;
  int argc_local;
  
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  memset(&cipher_suites.count,0,0x808);
  memset(&stack0xffffffffffffefd8,0,0x808);
  lifetime._6_2_ = 0x104;
  uStack_1038 = 0x76a700;
  do {
    iVar4 = getopt(argc,argv,"K:c:d:p:h");
    padded_length_00 = lifetime._6_2_;
    if (iVar4 == -1) {
      if (cipher_suites.elements[0xff] == (ptls_cipher_suite_t *)0x0) {
        cipher_suites.elements[0xff] = (ptls_cipher_suite_t *)0x1;
        local_1028 = &ptls_openssl_aes128gcmsha256;
      }
      if (key_exchanges.elements[0xff] == (ptls_key_exchange_context_t *)0x0) {
        fprintf(_stderr,"no private key specified\n");
        exit(1);
      }
      not_before = time((time_t *)0x0);
      iVar4 = emit_esni((ptls_key_exchange_context_t **)&cipher_suites.count,
                        &stack0xffffffffffffefd8,padded_length_00,not_before,uStack_1038);
      if (iVar4 != 0) {
        fprintf(_stderr,"failed to generate ESNI private structure.\n");
        exit(1);
      }
      return 0;
    }
    switch(iVar4) {
    case 0x4b:
      fp_00 = fopen(_optarg,"rt");
      pFVar3 = _stderr;
      pcVar2 = _optarg;
      if (fp_00 == (FILE *)0x0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar3,"failed to open file:%s:%s\n",pcVar2,pcVar6);
        exit(1);
      }
      pkey_00 = PEM_read_PrivateKey(fp_00,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
      pFVar3 = _stderr;
      pcVar2 = _optarg;
      if (pkey_00 == (EVP_PKEY *)0x0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar3,"failed to read private key from file:%s:%s\n",pcVar2,pcVar6);
        exit(1);
      }
      fclose(fp_00);
      iVar4 = ptls_openssl_create_key_exchange
                        (key_exchanges.elements +
                         (long)((long)&key_exchanges.elements[0xff][-1].on_exchange + 7),
                         (EVP_PKEY *)pkey_00);
      if (iVar4 != 0) {
        fprintf(_stderr,"unknown type of private key found in file:%s\n",_optarg);
        exit(1);
      }
      EVP_PKEY_free(pkey_00);
      key_exchanges.elements[0xff] =
           (ptls_key_exchange_context_t *)((long)&key_exchanges.elements[0xff]->algo + 1);
      break;
    default:
      usage(*argv,1);
      break;
    case 99:
      local_1058 = 0;
      while ((ptls_openssl_cipher_suites[local_1058] != (ptls_cipher_suite_t *)0x0 &&
             (iVar4 = strcasecmp(ptls_openssl_cipher_suites[local_1058]->aead->name,_optarg),
             iVar4 != 0))) {
        local_1058 = local_1058 + 1;
      }
      if (ptls_openssl_cipher_suites[local_1058] == (ptls_cipher_suite_t *)0x0) {
        fprintf(_stderr,"unknown cipher-suite: %s\n",_optarg);
        exit(1);
      }
      ppVar1 = cipher_suites.elements[0xff] + -1;
      cipher_suites.elements[0xff] =
           (ptls_cipher_suite_t *)((long)&cipher_suites.elements[0xff]->id + 1);
      cipher_suites.elements[(long)((long)&ppVar1->hash + 7)] =
           ptls_openssl_cipher_suites[local_1058];
      break;
    case 100:
      iVar4 = __isoc99_sscanf(_optarg,"%lu",&stack0xffffffffffffefc8);
      if ((iVar4 != 1) || (uStack_1038 == 0)) {
        fprintf(_stderr,"lifetime must be a positive integer\n");
        exit(1);
      }
      uStack_1038 = uStack_1038 * 0x15180;
      break;
    case 0x68:
      usage(*argv,0);
      break;
    case 0x70:
      iVar4 = __isoc99_sscanf(_optarg,"%hu",(long)&lifetime + 6);
      if ((iVar4 != 1) || (lifetime._6_2_ == 0)) {
        fprintf(_stderr,"padded length must be a positive integer\n");
        exit(1);
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    struct {
        ptls_key_exchange_context_t *elements[256];
        size_t count;
    } key_exchanges = {{NULL}, 0};
    struct {
        ptls_cipher_suite_t *elements[256];
        size_t count;
    } cipher_suites = {{NULL}, 0};
    uint16_t padded_length = 260;
    uint64_t lifetime = 90 * 86400;

    int ch;
    while ((ch = getopt(argc, argv, "K:c:d:p:h")) != -1) {
        switch (ch) {
        case 'K': {
            FILE *fp;
            EVP_PKEY *pkey;
            if ((fp = fopen(optarg, "rt")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            if ((pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL)) == NULL) {
                fprintf(stderr, "failed to read private key from file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            fclose(fp);
            if (ptls_openssl_create_key_exchange(key_exchanges.elements + key_exchanges.count++, pkey) != 0) {
                fprintf(stderr, "unknown type of private key found in file:%s\n", optarg);
                exit(1);
            }
            EVP_PKEY_free(pkey);
        } break;
        case 'c': {
            size_t i;
            for (i = 0; ptls_openssl_cipher_suites[i] != NULL; ++i)
                if (strcasecmp(ptls_openssl_cipher_suites[i]->aead->name, optarg) == 0)
                    break;
            if (ptls_openssl_cipher_suites[i] == NULL) {
                fprintf(stderr, "unknown cipher-suite: %s\n", optarg);
                exit(1);
            }
            cipher_suites.elements[cipher_suites.count++] = ptls_openssl_cipher_suites[i];
        } break;
        case 'd':
            if (sscanf(optarg, "%" SCNu64, &lifetime) != 1 || lifetime == 0) {
                fprintf(stderr, "lifetime must be a positive integer\n");
                exit(1);
            }
            lifetime *= 86400; /* convert to seconds */
            break;
        case 'p':
            if (sscanf(optarg, "%" SCNu16, &padded_length) != 1 || padded_length == 0) {
                fprintf(stderr, "padded length must be a positive integer\n");
                exit(1);
            }
            break;
        case 'h':
            usage(argv[0], 0);
            break;
        default:
            usage(argv[0], 1);
            break;
        }
    }
    if (cipher_suites.count == 0)
        cipher_suites.elements[cipher_suites.count++] = &ptls_openssl_aes128gcmsha256;
    if (key_exchanges.count == 0) {
        fprintf(stderr, "no private key specified\n");
        exit(1);
    }

    argc -= optind;
    argv += optind;

    if (emit_esni(key_exchanges.elements, cipher_suites.elements, padded_length, time(NULL), lifetime) != 0) {
        fprintf(stderr, "failed to generate ESNI private structure.\n");
        exit(1);
    }

    return 0;
}